

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_playback.c
# Opt level: O0

void decode_alDeleteBuffers(void)

{
  ALsizei n_00;
  uint32 uVar1;
  ALuint *orignames_00;
  ALuint *names_00;
  int local_24c;
  ALsizei i;
  ALuint *names;
  ALuint *orignames;
  undefined1 local_230 [4];
  ALsizei n;
  CallerInfo callerinfo;
  
  IO_ENTRYINFO((CallerInfo *)local_230);
  if (io_failure == 0) {
    n_00 = IO_ALSIZEI();
    orignames_00 = (ALuint *)IO_PTR();
    names_00 = (ALuint *)get_ioblob((long)n_00 << 2);
    for (local_24c = 0; local_24c < n_00; local_24c = local_24c + 1) {
      uVar1 = IO_UINT32();
      names_00[local_24c] = uVar1;
    }
    if (io_failure == 0) {
      visit_alDeleteBuffers((CallerInfo *)local_230,n_00,orignames_00,names_00);
    }
    for (local_24c = 0; local_24c < n_00; local_24c = local_24c + 1) {
      add_bufferlabel_to_map(names_00[local_24c],(char *)0x0);
    }
  }
  return;
}

Assistant:

static void decode_alDeleteBuffers(void)
{
    IO_START(alDeleteBuffers);
    const ALsizei n = IO_ALSIZEI();
    ALuint *orignames = (ALuint *) IO_PTR();
    ALuint *names = (ALuint *) get_ioblob(sizeof (ALuint) * n);
    ALsizei i;

    for (i = 0; i < n; i++) {
        names[i] = IO_UINT32();
    }

    if (!io_failure) visit_alDeleteBuffers(&callerinfo, n, orignames, names);

    for (i = 0; i < n; i++) {
        add_bufferlabel_to_map(names[i], NULL);
    }

    IO_END();
}